

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O2

bool iutest::TestSuite::IsSuccessfulTest(TestInfo *p)

{
  bool bVar1;
  
  if (p->m_ran != true) {
    return false;
  }
  bVar1 = TestInfo::is_skipped(p);
  if (bVar1) {
    return false;
  }
  bVar1 = TestResult::Passed(&p->m_test_result);
  return bVar1;
}

Assistant:

static bool IsReportableSkipTest(const TestInfo* p) { return p->is_reportable() && IsSkipTest(p); }